

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeGetUnusedPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int flags)

{
  DbPage *pPg;
  int iVar1;
  
  iVar1 = btreeGetPage(pBt,pgno,ppPage,flags);
  if (iVar1 == 0) {
    pPg = (*ppPage)->pDbPage;
    if ((int)pPg->nRef < 2) {
      (*ppPage)->isInit = '\0';
      iVar1 = 0;
    }
    else {
      sqlite3PagerUnrefNotNull(pPg);
      *ppPage = (MemPage *)0x0;
      iVar1 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11e13,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    }
  }
  else {
    *ppPage = (MemPage *)0x0;
  }
  return iVar1;
}

Assistant:

static int btreeGetUnusedPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int flags            /* PAGER_GET_NOCONTENT or PAGER_GET_READONLY */
){
  int rc = btreeGetPage(pBt, pgno, ppPage, flags);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  return rc;
}